

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error
client_handle_fullscreen_window
          (natwm_state *state,xcb_ewmh_wm_state_action_t action,xcb_window_t window)

{
  client *client_00;
  natwm_error local_40;
  client *client;
  xcb_window_t window_local;
  xcb_ewmh_wm_state_action_t action_local;
  natwm_state *state_local;
  
  client_00 = workspace_list_find_window_client(state->workspace_list,window);
  if (client_00 == (client *)0x0) {
    state_local._4_4_ = NOT_FOUND_ERROR;
  }
  else if (action == XCB_EWMH_WM_STATE_REMOVE) {
    state_local._4_4_ = client_unset_fullscreen(state,client_00);
  }
  else if (action == XCB_EWMH_WM_STATE_ADD) {
    state_local._4_4_ = client_set_fullscreen(state,client_00);
  }
  else if (action == XCB_EWMH_WM_STATE_TOGGLE) {
    if ((client_00->is_fullscreen & 1U) == 0) {
      local_40 = client_set_fullscreen(state,client_00);
    }
    else {
      local_40 = client_unset_fullscreen(state,client_00);
    }
    state_local._4_4_ = local_40;
  }
  else {
    state_local._4_4_ = GENERIC_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error client_handle_fullscreen_window(struct natwm_state *state,
                                                 xcb_ewmh_wm_state_action_t action,
                                                 xcb_window_t window)
{
        struct client *client = workspace_list_find_window_client(state->workspace_list, window);

        if (client == NULL) {
                return NOT_FOUND_ERROR;
        }

        switch (action) {
        case XCB_EWMH_WM_STATE_ADD:
                return client_set_fullscreen(state, client);
        case XCB_EWMH_WM_STATE_REMOVE:
                return client_unset_fullscreen(state, client);
        case XCB_EWMH_WM_STATE_TOGGLE:
                return (client->is_fullscreen) ? client_unset_fullscreen(state, client)
                                               : client_set_fullscreen(state, client);
        }

        return GENERIC_ERROR;
}